

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O1

Amount cfd::core::operator-(Amount *amount,int64_t satoshi_amount)

{
  int64_t amount_00;
  undefined8 unaff_RBP;
  Amount AVar1;
  Amount local_30;
  
  amount_00 = amount->amount_;
  Amount::CheckValidAmount(0x1b31ca);
  Amount::Amount(&local_30,amount_00);
  Amount::CheckValidAmount(0x1b31ec);
  AVar1._8_8_ = CONCAT71((int7)((ulong)unaff_RBP >> 8),local_30.ignore_check_) & 0xffffffff;
  AVar1.amount_ = local_30.amount_ - satoshi_amount;
  return AVar1;
}

Assistant:

Amount operator-(const Amount& amount, const int64_t satoshi_amount) {
  return Amount::CreateBySatoshiAmount(amount.GetSatoshiValue()) -=
         satoshi_amount;
}